

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_sync(void)

{
  int proc;
  int group_rank;
  long grp_id;
  
  grp_id = (long)GA_Default_Proc_Group;
  if (grp_id != -1) {
    if (grp_id < 1) {
      ARMCI_AllFence();
    }
    else if (0 < PGRP_LIST[grp_id].map_nproc) {
      group_rank = 0;
      do {
        proc = ARMCI_Absolute_id(&PGRP_LIST[grp_id].group,group_rank);
        ARMCI_Fence(proc);
        group_rank = group_rank + 1;
      } while (group_rank < PGRP_LIST[grp_id].map_nproc);
    }
    pnga_msg_pgroup_sync(grp_id);
    if (GA_fence_set != 0) {
      memset(fence_array,0,(long)(int)GAnproc);
    }
    GA_fence_set = 0;
    return;
  }
  ARMCI_AllFence();
  pnga_msg_sync();
  if (GA_fence_set != 0) {
    memset(fence_array,0,(long)(int)GAnproc);
  }
  GA_fence_set = 0;
  return;
}

Assistant:

void pnga_sync()
{
  GA_Internal_Threadsafe_Lock();
#ifdef CHECK_MA
  Integer status;
#endif

#ifdef USE_ARMCI_GROUP_FENCE
  if (GA_Default_Proc_Group == -1) {
    int grp_id = (int)GA_Default_Proc_Group;
    ARMCI_GroupFence(&grp_id);
    pnga_msg_sync();
  } else {
    int grp_id = (Integer)GA_Default_Proc_Group;
    pnga_pgroup_sync(grp_id);
  }
#else
  if (GA_Default_Proc_Group == -1) {
    ARMCI_AllFence();
    pnga_msg_sync();
    if(GA_fence_set)bzero(fence_array,(int)GAnproc);
    GA_fence_set=0;
  } else {
    Integer grp_id = (Integer)GA_Default_Proc_Group;
    pnga_pgroup_sync(grp_id);
  }
#endif
#ifdef CHECK_MA
  status = MA_verify_allocator_stuff();
#endif
  GA_Internal_Threadsafe_Unlock();
}